

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O1

Result __thiscall wabt::TypeChecker::OnBrTableTarget(TypeChecker *this,Index depth)

{
  _anonymous_namespace_ *this_00;
  _Alloc_hider _Var1;
  Result RVar2;
  int *piVar3;
  int *prefix;
  int *piVar4;
  _anonymous_namespace_ *this_01;
  bool bVar5;
  bool bVar6;
  Label *label;
  Label *local_68;
  string local_60;
  string local_40;
  
  RVar2 = GetLabel(this,depth,&local_68);
  bVar5 = true;
  if (RVar2.enum_ != Error) {
    this_01 = (_anonymous_namespace_ *)&local_68->result_types;
    if (local_68->label_type == Loop) {
      this_01 = (_anonymous_namespace_ *)&local_68->param_types;
    }
    RVar2 = CheckSignature(this,(TypeVector *)this_01,"br_table");
    bVar5 = RVar2.enum_ == Error;
    this_00 = (_anonymous_namespace_ *)this->br_table_sig_;
    if (this_00 == (_anonymous_namespace_ *)0x0) {
      this->br_table_sig_ = (TypeVector *)this_01;
    }
    else {
      piVar3 = *(int **)this_00;
      prefix = *(int **)(this_00 + 8);
      if ((this->features_).reference_types_enabled_ == true) {
        if ((long)prefix - (long)piVar3 >> 2 == *(long *)(this_01 + 8) - *(long *)this_01 >> 2)
        goto LAB_00189e34;
        PrintError(this,"br_table labels have inconsistent arity: expected %zd got %zd");
      }
      else {
        piVar4 = *(int **)this_01;
        if ((long)prefix - (long)piVar3 == *(long *)(this_01 + 8) - (long)piVar4) {
          bVar6 = piVar3 == prefix;
          if (bVar6) {
LAB_00189dcb:
            if (bVar6) goto LAB_00189e34;
          }
          else if (*piVar3 == *piVar4) {
            do {
              piVar4 = piVar4 + 1;
              piVar3 = piVar3 + 1;
              bVar6 = piVar3 == prefix;
              if (bVar6) goto LAB_00189dcb;
            } while (*piVar3 == *piVar4);
          }
        }
        (anonymous_namespace)::TypesToString_abi_cxx11_
                  (&local_40,this_00,(TypeVector *)0x0,(char *)prefix);
        _Var1._M_p = local_40._M_dataplus._M_p;
        (anonymous_namespace)::TypesToString_abi_cxx11_
                  (&local_60,this_01,(TypeVector *)0x0,(char *)prefix);
        PrintError(this,"br_table labels have inconsistent types: expected %s, got %s",_Var1._M_p,
                   local_60._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_40._M_dataplus._M_p != &local_40.field_2) {
          operator_delete(local_40._M_dataplus._M_p);
        }
      }
      bVar5 = true;
    }
  }
LAB_00189e34:
  RVar2.enum_._1_3_ = 0;
  RVar2.enum_._0_1_ = bVar5;
  return (Result)RVar2.enum_;
}

Assistant:

Result TypeChecker::OnBrTableTarget(Index depth) {
  Result result = Result::Ok;
  Label* label;
  CHECK_RESULT(GetLabel(depth, &label));
  TypeVector& label_sig = label->br_types();
  result |= CheckSignature(label_sig, "br_table");

  // Make sure this label's signature is consistent with the previous labels'
  // signatures.
  if (br_table_sig_ == nullptr) {
    br_table_sig_ = &label_sig;
  } else {
    if (features_.reference_types_enabled()) {
      if (br_table_sig_->size() != label_sig.size()) {
        result |= Result::Error;
        PrintError("br_table labels have inconsistent arity: expected %" PRIzd
                   " got %" PRIzd,
                   br_table_sig_->size(), label_sig.size());
      }
    } else {
      if (*br_table_sig_ != label_sig) {
        result |= Result::Error;
        PrintError(
            "br_table labels have inconsistent types: expected %s, got %s",
            TypesToString(*br_table_sig_).c_str(),
            TypesToString(label_sig).c_str());
      }
    }
  }

  return result;
}